

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsStateChangePerfTestCases.cpp
# Opt level: O0

void __thiscall
deqp::gls::StateChangePerformanceCase::requireFramebuffers
          (StateChangePerformanceCase *this,int count)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  size_type sVar4;
  reference pvVar5;
  value_type_conflict4 local_24;
  long lStack_20;
  GLuint framebuffer;
  Functions *gl;
  StateChangePerformanceCase *pSStack_10;
  int count_local;
  StateChangePerformanceCase *this_local;
  
  gl._4_4_ = count;
  pSStack_10 = this;
  iVar2 = (*this->m_renderCtx->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar2);
  sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_framebuffers);
  if ((int)sVar4 < gl._4_4_) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_framebuffers,(long)gl._4_4_);
    requireRenderbuffers(this,gl._4_4_);
    while (sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                             (&this->m_framebuffers), (int)sVar4 < gl._4_4_) {
      (**(code **)(lStack_20 + 0x6d0))(1,&local_24);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glGenFramebuffers()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x189);
      (**(code **)(lStack_20 + 0x78))(0x8d40,local_24);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glBindFramebuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x18c);
      pcVar1 = *(code **)(lStack_20 + 0xa0);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_framebuffers);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_renderbuffers,sVar4);
      (*pcVar1)(0x8d41,*pvVar5);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glBindRenderbuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,399);
      pcVar1 = *(code **)(lStack_20 + 0x688);
      sVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->m_framebuffers);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->m_renderbuffers,sVar4);
      (*pcVar1)(0x8d40,0x8ce0,0x8d41,*pvVar5);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glFramebufferRenderbuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x192);
      (**(code **)(lStack_20 + 0xa0))(0x8d41,0);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glBindRenderbuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x195);
      (**(code **)(lStack_20 + 0x78))(0x8d40,0);
      dVar3 = (**(code **)(lStack_20 + 0x800))();
      glu::checkError(dVar3,"glBindFramebuffer()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsStateChangePerfTestCases.cpp"
                      ,0x198);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&this->m_framebuffers,&local_24);
    }
  }
  return;
}

Assistant:

void StateChangePerformanceCase::requireFramebuffers (int count)
{
	const glw::Functions& gl = m_renderCtx.getFunctions();

	if ((int)m_framebuffers.size() >= count)
		return;

	m_framebuffers.reserve(count);

	requireRenderbuffers(count);

	while ((int)m_framebuffers.size() < count)
	{
		GLuint framebuffer;

		gl.genFramebuffers(1, &framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGenFramebuffers()");

		gl.bindFramebuffer(GL_FRAMEBUFFER, framebuffer);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");

		gl.bindRenderbuffer(GL_RENDERBUFFER, m_renderbuffers[m_framebuffers.size()]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer()");

		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, m_renderbuffers[m_framebuffers.size()]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glFramebufferRenderbuffer()");

		gl.bindRenderbuffer(GL_RENDERBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindRenderbuffer()");

		gl.bindFramebuffer(GL_FRAMEBUFFER, 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindFramebuffer()");

		m_framebuffers.push_back(framebuffer);
	}
}